

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int32_t zng_deflateEnd(zng_stream *strm)

{
  deflate_allocs *pdVar1;
  int iVar2;
  
  iVar2 = deflateStateCheck(strm);
  if (iVar2 == 0) {
    iVar2 = strm->state->status;
    pdVar1 = strm->state->alloc_bufs;
    if (pdVar1 != (deflate_allocs *)0x0) {
      (*pdVar1->zfree)(strm->opaque,pdVar1->buf_start);
      strm->state = (internal_state *)0x0;
    }
    iVar2 = (uint)(iVar2 != 2) * 3 + -3;
  }
  else {
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateEnd)(PREFIX3(stream) *strm) {
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;

    int32_t status = strm->state->status;

    /* Free allocated buffers */
    free_deflate(strm);

    return status == BUSY_STATE ? Z_DATA_ERROR : Z_OK;
}